

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getHighsLpData
                   (HighsLp *lp,HighsInt a_format,HighsInt *num_col,HighsInt *num_row,
                   HighsInt *num_nz,HighsInt *sense,double *offset,double *col_cost,
                   double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                   HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *integrality)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  HighsInt HVar4;
  double *pdVar5;
  int *piVar6;
  size_type sVar7;
  const_reference pvVar8;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  undefined8 *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  HighsSparseMatrix *in_stack_00000048;
  long in_stack_00000050;
  int iCol;
  HighsSparseMatrix local_matrix;
  HighsInt num_start_entries;
  MatrixFormat desired_a_format;
  HighsSparseMatrix *in_stack_fffffffffffffed8;
  HighsSparseMatrix *in_stack_fffffffffffffee0;
  HighsSparseMatrix *in_stack_ffffffffffffff08;
  HighsSparseMatrix *in_stack_ffffffffffffff10;
  int local_b8;
  HighsSparseMatrix *in_stack_ffffffffffffffb0;
  
  iVar3 = 2;
  if (in_ESI == 1) {
    iVar3 = 1;
  }
  *in_R9 = in_RDI[0x3c];
  *in_stack_00000008 = *(undefined8 *)(in_RDI + 0x3e);
  *in_RDX = *in_RDI;
  *in_RCX = in_RDI[1];
  *in_R8 = 0;
  if (0 < *in_RDX) {
    if (in_stack_00000010 != (void *)0x0) {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43a8f9);
      memcpy(in_stack_00000010,pdVar5,(long)*in_RDX << 3);
    }
    if (in_stack_00000018 != (void *)0x0) {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43a93e);
      memcpy(in_stack_00000018,pdVar5,(long)*in_RDX << 3);
    }
    if (in_stack_00000020 != (void *)0x0) {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43a983);
      memcpy(in_stack_00000020,pdVar5,(long)*in_RDX << 3);
    }
  }
  if (0 < *in_RCX) {
    if (in_stack_00000028 != (void *)0x0) {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43a9db);
      memcpy(in_stack_00000028,pdVar5,(long)*in_RCX << 3);
    }
    if (in_stack_00000030 != (void *)0x0) {
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43aa20);
      memcpy(in_stack_00000030,pdVar5,(long)*in_RCX << 3);
    }
  }
  if ((*in_RDX < 1) || (*in_RCX < 1)) goto LAB_0043ad4a;
  if (iVar3 == 1) {
    iVar1 = *in_RDX;
    bVar2 = HighsSparseMatrix::isColwise((HighsSparseMatrix *)(in_RDI + 0x20));
    if (!bVar2) goto LAB_0043aab5;
  }
  else {
    iVar1 = *in_RCX;
LAB_0043aab5:
    if ((iVar3 != 2) ||
       (bVar2 = HighsSparseMatrix::isRowwise((HighsSparseMatrix *)(in_RDI + 0x20)), !bVar2)) {
      HighsSparseMatrix::HighsSparseMatrix(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (iVar3 == 1) {
        HighsSparseMatrix::ensureColwise(in_stack_ffffffffffffffb0);
      }
      else {
        HighsSparseMatrix::ensureRowwise(in_stack_ffffffffffffffb0);
      }
      HVar4 = HighsSparseMatrix::numNz(in_stack_fffffffffffffed8);
      *in_R8 = HVar4;
      if (in_stack_00000038 != (void *)0x0) {
        piVar6 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x43ac98);
        memcpy(in_stack_00000038,piVar6,(long)iVar1 << 2);
      }
      if (in_stack_00000040 != (void *)0x0) {
        piVar6 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x43acda);
        memcpy(in_stack_00000040,piVar6,(long)*in_R8 << 2);
      }
      if (in_stack_00000048 != (HighsSparseMatrix *)0x0) {
        pdVar5 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x43ad1f);
        memcpy(in_stack_00000048,pdVar5,(long)*in_R8 << 3);
        in_stack_fffffffffffffee0 = in_stack_00000048;
      }
      HighsSparseMatrix::~HighsSparseMatrix(in_stack_fffffffffffffee0);
      goto LAB_0043ad4a;
    }
  }
  HVar4 = HighsSparseMatrix::numNz(in_stack_fffffffffffffed8);
  *in_R8 = HVar4;
  if (in_stack_00000038 != (void *)0x0) {
    piVar6 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x43ab30);
    memcpy(in_stack_00000038,piVar6,(long)iVar1 << 2);
  }
  if (in_stack_00000040 != (void *)0x0) {
    piVar6 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x43ab79);
    memcpy(in_stack_00000040,piVar6,(long)*in_R8 << 2);
  }
  if (in_stack_00000048 != (HighsSparseMatrix *)0x0) {
    pdVar5 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x43abc5);
    memcpy(in_stack_00000048,pdVar5,(long)*in_R8 << 3);
  }
LAB_0043ad4a:
  sVar7 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e));
  if (((int)sVar7 != 0) && (in_stack_00000050 != 0)) {
    for (local_b8 = 0; local_b8 < *in_RDX; local_b8 = local_b8 + 1) {
      pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x5e),
                          (long)local_b8);
      *(uint *)(in_stack_00000050 + (long)local_b8 * 4) = (uint)*pvVar8;
    }
  }
  return 0;
}

Assistant:

HighsInt Highs_getHighsLpData(const HighsLp& lp, const HighsInt a_format,
                              HighsInt* num_col, HighsInt* num_row,
                              HighsInt* num_nz, HighsInt* sense, double* offset,
                              double* col_cost, double* col_lower,
                              double* col_upper, double* row_lower,
                              double* row_upper, HighsInt* a_start,
                              HighsInt* a_index, double* a_value,
                              HighsInt* integrality) {
  const MatrixFormat desired_a_format =
      a_format == HighsInt(MatrixFormat::kColwise) ? MatrixFormat::kColwise
                                                   : MatrixFormat::kRowwise;
  *sense = (HighsInt)lp.sense_;
  *offset = lp.offset_;
  *num_col = lp.num_col_;
  *num_row = lp.num_row_;
  *num_nz = 0;  // In case one of the matrix dimensions is zero
  if (*num_col > 0) {
    if (col_cost)
      memcpy(col_cost, lp.col_cost_.data(), *num_col * sizeof(double));
    if (col_lower)
      memcpy(col_lower, lp.col_lower_.data(), *num_col * sizeof(double));
    if (col_upper)
      memcpy(col_upper, lp.col_upper_.data(), *num_col * sizeof(double));
  }
  if (*num_row > 0) {
    if (row_lower)
      memcpy(row_lower, lp.row_lower_.data(), *num_row * sizeof(double));
    if (row_upper)
      memcpy(row_upper, lp.row_upper_.data(), *num_row * sizeof(double));
  }

  // Nothing to do if one of the matrix dimensions is zero
  if (*num_col > 0 && *num_row > 0) {
    // Determine the desired orientation and number of start entries to
    // be copied
    const HighsInt num_start_entries =
        desired_a_format == MatrixFormat::kColwise ? *num_col : *num_row;
    if ((desired_a_format == MatrixFormat::kColwise &&
         lp.a_matrix_.isColwise()) ||
        (desired_a_format == MatrixFormat::kRowwise &&
         lp.a_matrix_.isRowwise())) {
      // Incumbent format is OK
      *num_nz = lp.a_matrix_.numNz();
      if (a_start)
        memcpy(a_start, lp.a_matrix_.start_.data(),
               num_start_entries * sizeof(HighsInt));
      if (a_index)
        memcpy(a_index, lp.a_matrix_.index_.data(), *num_nz * sizeof(HighsInt));
      if (a_value)
        memcpy(a_value, lp.a_matrix_.value_.data(), *num_nz * sizeof(double));
    } else {
      // Take a copy and transpose it
      HighsSparseMatrix local_matrix = lp.a_matrix_;
      if (desired_a_format == MatrixFormat::kColwise) {
        assert(local_matrix.isRowwise());
        local_matrix.ensureColwise();
      } else {
        assert(local_matrix.isColwise());
        local_matrix.ensureRowwise();
      }
      *num_nz = local_matrix.numNz();
      if (a_start)
        memcpy(a_start, local_matrix.start_.data(),
               num_start_entries * sizeof(HighsInt));
      if (a_index)
        memcpy(a_index, local_matrix.index_.data(), *num_nz * sizeof(HighsInt));
      if (a_value)
        memcpy(a_value, local_matrix.value_.data(), *num_nz * sizeof(double));
    }
  }
  if (HighsInt(lp.integrality_.size()) && integrality) {
    for (int iCol = 0; iCol < *num_col; iCol++)
      integrality[iCol] = HighsInt(lp.integrality_[iCol]);
  }
  return kHighsStatusOk;
}